

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

FString GetStatString(void)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  FString *in_RDI;
  uint i;
  ulong uVar4;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  in_RDI->Chars = FString::NullString.Nothing;
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < LevelData.Count; uVar4 = uVar4 + 1) {
    iVar1 = *(int *)((long)&(LevelData.Array)->leveltime + lVar3);
    uVar2 = (long)iVar1 / 0x23;
    FString::AppendFormat
              (in_RDI,"Level %s - Kills: %d/%d - Secrets: %d/%d - Time: %d:%02d\n",
               *(undefined8 *)((long)&((LevelData.Array)->Levelname).Chars + lVar3),
               (ulong)*(uint *)((long)&(LevelData.Array)->killcount + lVar3),
               (ulong)*(uint *)((long)&(LevelData.Array)->totalkills + lVar3),
               (ulong)*(uint *)((long)&(LevelData.Array)->secretcount + lVar3),
               (ulong)*(uint *)((long)&(LevelData.Array)->totalsecrets + lVar3),
               (long)iVar1 / 0x834 & 0xffffffff,
               (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % 0x3c &
               0xffffffff);
    lVar3 = lVar3 + 0x20;
  }
  return (FString)(char *)in_RDI;
}

Assistant:

FString GetStatString()
{
	FString compose;
	for(unsigned i = 0; i < LevelData.Size(); i++)
	{
		OneLevel *l = &LevelData[i];
		compose.AppendFormat("Level %s - Kills: %d/%d - Secrets: %d/%d - Time: %d:%02d\n", 
			l->Levelname.GetChars(), l->killcount, l->totalkills, l->secretcount, l->totalsecrets,
			l->leveltime/(60*TICRATE), (l->leveltime/TICRATE)%60);
	}
	return compose;
}